

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateFastInlineHasOwnProperty(Lowerer *this,Instr *instr)

{
  OpCode OVar1;
  Instr *argoutInlineSpecialized;
  code *pcVar2;
  bool bVar3;
  DWORD offset;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  Lowerer *pLVar7;
  RegOpnd *pRVar8;
  LabelInstr *target;
  LabelInstr *labelTarget;
  IndirOpnd *pIVar9;
  Opnd *pOVar10;
  RegOpnd *pRVar11;
  LabelInstr *pLVar12;
  Opnd *pOVar13;
  IntConstOpnd *pIVar14;
  undefined4 uVar15;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_6e;
  undefined4 local_6c;
  Lowerer *local_68;
  RegOpnd *local_60;
  Opnd *pOStack_58;
  Opnd *argsOpnd [2];
  LabelInstr *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4f18,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar3) goto LAB_0054c789;
    *puVar4 = 0;
  }
  pSVar5 = IR::Opnd::AsSymOpnd(instr->m_src2);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  argoutInlineSpecialized = (pSVar6->field_5).m_instrDef;
  pOStack_58 = (Opnd *)0x0;
  argsOpnd[0] = (Opnd *)0x0;
  bVar3 = IR::Instr::FetchOperands(instr,&pOStack_58,2);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4f21,"(result)","result");
    if (!bVar3) goto LAB_0054c789;
    *puVar4 = 0;
  }
  if (pOStack_58 == (Opnd *)0x0 || argsOpnd[0] == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4f22,"(argsOpnd[0] && argsOpnd[1])","argsOpnd[0] && argsOpnd[1]");
    if (!bVar3) {
LAB_0054c789:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  local_32 = (argsOpnd[0]->m_valueType).field_0;
  bVar3 = ValueType::IsNotString((ValueType *)&local_32.field_0);
  if (!bVar3) {
    local_6e = (pOStack_58->m_valueType).field_0;
    bVar3 = ValueType::IsNotObject((ValueType *)&local_6e.field_0);
    if (!bVar3) {
      bVar3 = IR::Opnd::IsRegOpnd(pOStack_58);
      if (bVar3) {
        bVar3 = IR::Opnd::IsRegOpnd(argsOpnd[0]);
        if (bVar3) {
          pLVar7 = (Lowerer *)IR::Opnd::AsRegOpnd(pOStack_58);
          pRVar8 = IR::Opnd::AsRegOpnd(argsOpnd[0]);
          local_32 = (pRVar8->super_Opnd).m_valueType.field_0;
          bVar3 = ValueType::IsString((ValueType *)&local_32.field_0);
          if ((bVar3) && ((pRVar8->m_sym->field_0x18 & 1) != 0)) {
            OVar1 = ((pRVar8->m_sym->field_5).m_instrDef)->m_opcode;
            uVar15 = (undefined4)
                     CONCAT71((int7)((ulong)pRVar8 >> 8),OVar1 == BrOnNotEmpty || OVar1 == BrOnEmpty
                             );
          }
          else {
            uVar15 = 0;
          }
          local_68 = pLVar7;
          local_60 = pRVar8;
          target = InsertLabel(false,instr->m_next);
          labelTarget = InsertLabel(true,instr);
          local_6c = uVar15;
          local_40 = labelTarget;
          if ((char)uVar15 != '\0') {
            local_40 = IR::LabelInstr::New(Label,this->m_func,true);
          }
          pRVar8 = local_60;
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,&local_60->super_Opnd,&labelTarget->super_Instr,labelTarget,
                     false);
          pIVar9 = IR::IndirOpnd::New(pRVar8,0,TyUint64,this->m_func,false);
          pLVar7 = this;
          pOVar10 = LoadVTableValueOpnd(this,&labelTarget->super_Instr,VtablePropertyString);
          InsertCompareBranch(pLVar7,&pIVar9->super_Opnd,pOVar10,BrNeq_A,labelTarget,
                              &labelTarget->super_Instr,false);
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,(Opnd *)local_68,&labelTarget->super_Instr,labelTarget,false
                    );
          pRVar8 = IR::RegOpnd::New(TyUint64,this->m_func);
          pIVar9 = IR::IndirOpnd::New(local_60,0x28,TyUint64,this->m_func,false);
          InsertMove(&pRVar8->super_Opnd,&pIVar9->super_Opnd,&labelTarget->super_Instr,true);
          pRVar11 = IR::RegOpnd::New(TyUint64,this->m_func);
          pIVar9 = IR::IndirOpnd::New((RegOpnd *)local_68,8,TyUint64,this->m_func,false);
          InsertMove(&pRVar11->super_Opnd,&pIVar9->super_Opnd,&labelTarget->super_Instr,true);
          local_60 = pRVar11;
          GenerateDynamicLoadPolymorphicInlineCacheSlot
                    (this,&labelTarget->super_Instr,pRVar8,&pRVar11->super_Opnd);
          pLVar12 = IR::LabelInstr::New(Label,this->m_func,false);
          GenerateLocalInlineCacheCheck(&labelTarget->super_Instr,pRVar11,pRVar8,pLVar12,false);
          pOVar10 = instr->m_dst;
          pOVar13 = LoadLibraryValueOpnd(this,instr,ValueTrue);
          InsertMove(pOVar10,pOVar13,&labelTarget->super_Instr,true);
          InsertBranch(Br,target,&labelTarget->super_Instr);
          IR::Instr::InsertBefore(&labelTarget->super_Instr,&pLVar12->super_Instr);
          pRVar11 = IR::RegOpnd::New(TyInt64,this->m_func);
          LowererMD::GenerateLoadTaggedType(&labelTarget->super_Instr,local_60,pRVar11);
          GenerateLocalInlineCacheCheck(&labelTarget->super_Instr,pRVar11,pRVar8,local_40,false);
          pOVar10 = instr->m_dst;
          pOVar13 = LoadLibraryValueOpnd(this,instr,ValueTrue);
          InsertMove(pOVar10,pOVar13,&labelTarget->super_Instr,true);
          pLVar7 = (Lowerer *)0x9;
          InsertBranch(Br,target,&labelTarget->super_Instr);
          if ((char)local_6c != '\0') {
            IR::Instr::InsertBefore(&labelTarget->super_Instr,&local_40->super_Instr);
            pRVar8 = IR::Opnd::AsRegOpnd(argsOpnd[0]);
            pOVar10 = ((pRVar8->m_sym->field_5).m_instrDef)->m_src1;
            pOVar13 = GetForInEnumeratorFieldOpnd(this,pOVar10,0x50,TyInt8);
            pLVar7 = (Lowerer *)0x0;
            pIVar14 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
            InsertCompareBranch(pLVar7,pOVar13,&pIVar14->super_Opnd,BrEq_A,labelTarget,
                                &labelTarget->super_Instr,false);
            pRVar8 = IR::RegOpnd::New(TyUint64,this->m_func);
            pOVar13 = GetForInEnumeratorFieldOpnd(this,pOVar10,0x10,TyUint64);
            InsertMove(&pRVar8->super_Opnd,pOVar13,&labelTarget->super_Instr,true);
            offset = Js::DynamicObject::GetOffsetOfType();
            pLVar7 = local_68;
            pIVar9 = IR::IndirOpnd::New((RegOpnd *)local_68,offset,TyUint64,this->m_func,false);
            InsertCompareBranch(pLVar7,&pRVar8->super_Opnd,&pIVar9->super_Opnd,BrNeq_A,labelTarget,
                                &labelTarget->super_Instr,false);
            pLVar12 = IR::LabelInstr::New(Label,this->m_func,true);
            pOVar10 = GetForInEnumeratorFieldOpnd(this,pOVar10,0x51,TyInt8);
            pLVar7 = (Lowerer *)0x0;
            pIVar14 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
            InsertCompareBranch(pLVar7,pOVar10,&pIVar14->super_Opnd,BrNeq_A,pLVar12,
                                &labelTarget->super_Instr,false);
            pOVar10 = instr->m_dst;
            pOVar13 = LoadLibraryValueOpnd(this,instr,ValueTrue);
            InsertMove(pOVar10,pOVar13,&labelTarget->super_Instr,true);
            InsertBranch(Br,target,&labelTarget->super_Instr);
            IR::Instr::InsertBefore(&labelTarget->super_Instr,&pLVar12->super_Instr);
            pOVar10 = instr->m_dst;
            pOVar13 = LoadLibraryValueOpnd(this,instr,ValueFalse);
            InsertMove(pOVar10,pOVar13,&labelTarget->super_Instr,true);
            pLVar7 = (Lowerer *)0x9;
            InsertBranch(Br,target,&labelTarget->super_Instr);
          }
          RelocateCallDirectToHelperPath(pLVar7,argoutInlineSpecialized,labelTarget);
        }
      }
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineHasOwnProperty(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

    //CallDirect src2
    IR::Opnd * linkOpnd = instr->GetSrc2();
    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2] = { 0 };
    bool result = instr->FetchOperands(argsOpnd, 2);
    Assert(result);
    AnalysisAssert(argsOpnd[0] && argsOpnd[1]);

    if (argsOpnd[1]->GetValueType().IsNotString()
        || argsOpnd[0]->GetValueType().IsNotObject()
        || !argsOpnd[0]->IsRegOpnd()
        || !argsOpnd[1]->IsRegOpnd())
    {
        return;
    }

    IR::RegOpnd * thisObj = argsOpnd[0]->AsRegOpnd();
    IR::RegOpnd * propOpnd = argsOpnd[1]->AsRegOpnd();

    // fast path case where hasOwnProperty is being called using a property name loaded via a for-in loop
    bool generateForInFastpath = propOpnd->GetValueType().IsString()
        && propOpnd->m_sym->m_isSingleDef
        && (propOpnd->m_sym->m_instrDef->m_opcode == Js::OpCode::BrOnEmpty
            || propOpnd->m_sym->m_instrDef->m_opcode == Js::OpCode::BrOnNotEmpty);

    IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
    IR::LabelInstr * labelHelper = InsertLabel(true, instr);

    IR::LabelInstr * cacheMissLabel = generateForInFastpath ? IR::LabelInstr::New(Js::OpCode::Label, m_func, true) : labelHelper;

    IR::Instr * insertInstr = labelHelper;

    //    GenerateObjectTest(propOpnd, $labelHelper)
    //    CMP indexOpnd, PropertyString::`vtable'
    //    JNE $helper
    //    GenerateObjectTest(thisObj, $labelHelper)
    //    MOV inlineCacheOpnd, propOpnd->lsElemInlineCache
    //    MOV objectTypeOpnd, thisObj->type
    //    GenerateDynamicLoadPolymorphicInlineCacheSlot(inlineCacheOpnd, objectTypeOpnd)        ; loads inline cache for given type
    //    GenerateLocalInlineCacheCheck(objectTypeOpnd, inlineCacheOpnd, $notInlineSlotsLabel)  ; check for type in inline slots, jump to $notInlineSlotsLabel on failure
    //    MOV dst, ValueTrue
    //    JMP $done
    // $notInlineSlotsLabel:
    //    GenerateLoadTaggedType(objectTypeOpnd, opndTaggedType)
    //    GenerateLocalInlineCacheCheck(opndTaggedType, inlineCacheOpnd, $cacheMissLabel)       ; check for type in aux slot, jump to $cacheMissLabel on failure
    //    MOV dst, ValueTrue
    //    JMP $done

    m_lowererMD.GenerateObjectTest(propOpnd, insertInstr, labelHelper);

    InsertCompareBranch(IR::IndirOpnd::New(propOpnd, 0, TyMachPtr, m_func), LoadVTableValueOpnd(insertInstr, VTableValue::VtablePropertyString), Js::OpCode::BrNeq_A, labelHelper, insertInstr);

    m_lowererMD.GenerateObjectTest(thisObj, insertInstr, labelHelper);

    IR::RegOpnd * inlineCacheOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(propOpnd, Js::PropertyString::GetOffsetOfLdElemInlineCache(), TyMachPtr, m_func), insertInstr);

    IR::RegOpnd * objectTypeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(objectTypeOpnd, IR::IndirOpnd::New(thisObj, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, m_func), insertInstr);

    GenerateDynamicLoadPolymorphicInlineCacheSlot(insertInstr, inlineCacheOpnd, objectTypeOpnd);

    IR::LabelInstr * notInlineSlotsLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    GenerateLocalInlineCacheCheck(insertInstr, objectTypeOpnd, inlineCacheOpnd, notInlineSlotsLabel);

    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    insertInstr->InsertBefore(notInlineSlotsLabel);
    IR::RegOpnd * opndTaggedType = IR::RegOpnd::New(TyMachReg, m_func);
    m_lowererMD.GenerateLoadTaggedType(insertInstr, objectTypeOpnd, opndTaggedType);
    GenerateLocalInlineCacheCheck(insertInstr, opndTaggedType, inlineCacheOpnd, cacheMissLabel);
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    if (!generateForInFastpath)
    {
        RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
        return;
    }

    insertInstr->InsertBefore(cacheMissLabel);

    //    CMP forInEnumeratorOpnd->canUseJitFastPath, 0
    //    JEQ $labelHelper
    //    MOV cachedDataTypeOpnd, forInEnumeratorOpnd->enumeratorInitialType
    //    CMP thisObj->type, cachedDataTypeOpnd
    //    JNE $labelHelper
    //    CMP forInEnumeratorOpnd->enumeratingPrototype, 0
    //    JNE $falseLabel
    //    MOV dst, True
    //    JMP $doneLabel
    //    $falseLabel: [helper]
    //    MOV dst, False
    //    JMP $doneLabel
    // $labelHelper: [helper]
    //    CallDirect code
    //    ...
    // $doneLabel:

    IR::Opnd * forInEnumeratorOpnd = argsOpnd[1]->AsRegOpnd()->m_sym->m_instrDef->GetSrc1();

    // go to helper if we can't use JIT fastpath
    IR::Opnd * canUseJitFastPathOpnd = GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfCanUseJitFastPath(), TyInt8);
    InsertCompareBranch(canUseJitFastPathOpnd, IR::IntConstOpnd::New(0, TyInt8, m_func), Js::OpCode::BrEq_A, labelHelper, insertInstr);

    // go to helper if initial type is not same as the object we are querying
    IR::RegOpnd * cachedDataTypeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(cachedDataTypeOpnd, GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorInitialType(), TyMachPtr), insertInstr);
    InsertCompareBranch(cachedDataTypeOpnd, IR::IndirOpnd::New(thisObj, Js::DynamicObject::GetOffsetOfType(), TyMachPtr, m_func), Js::OpCode::BrNeq_A, labelHelper, insertInstr);

    // if we haven't yet gone to helper, then we can check if we are enumerating the prototype to know if property is an own property
    IR::LabelInstr *falseLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::Opnd * enumeratingPrototype = GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratingPrototype(), TyInt8);
    InsertCompareBranch(enumeratingPrototype, IR::IntConstOpnd::New(0, TyInt8, m_func), Js::OpCode::BrNeq_A, falseLabel, insertInstr);

    // assume true is the main path
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    // load false on helper path
    insertInstr->InsertBefore(falseLabel);
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
}